

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall RingtoneScreen::RingtoneScreen(RingtoneScreen *this,QWidget *parent)

{
  QVBoxLayout *this_00;
  TextLabel *this_01;
  QLatin1String latin1;
  QArrayDataPointer<char16_t> QStack_38;
  
  QWidget::QWidget(&this->super_QWidget,parent,0);
  *(undefined ***)this = &PTR_metaObject_001ac320;
  *(undefined ***)&this->field_0x10 = &PTR__RingtoneScreen_001ac4d0;
  this_00 = (QVBoxLayout *)operator_new(0x20);
  QVBoxLayout::QVBoxLayout(this_00,&this->super_QWidget);
  this_01 = (TextLabel *)operator_new(0x30);
  QtMWidgets::TextLabel::TextLabel(this_01,&this->super_QWidget,(WindowFlags)0x0);
  latin1.m_data = "We have to implement list with ringtones in the future";
  latin1.m_size = 0x36;
  QString::QString((QString *)&QStack_38,latin1);
  QtMWidgets::TextLabel::setText(this_01,(QString *)&QStack_38);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_38);
  QBoxLayout::addWidget(this_00,this_01,0,0);
  return;
}

Assistant:

RingtoneScreen( QWidget * parent )
		:	QWidget( parent )
	{
		QVBoxLayout * l = new QVBoxLayout( this );

		QtMWidgets::TextLabel * label = new QtMWidgets::TextLabel( this );
		label->setText( QLatin1String( "We have to implement list with "
			"ringtones in the future" ) );

		l->addWidget( label );
	}